

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFunc.cpp
# Opt level: O0

double __thiscall commandClass::log(commandClass *this,double __x)

{
  _Ios_Openmode __a;
  ostream *poVar1;
  char *pcVar2;
  double dVar3;
  int Case;
  int i;
  double expend_;
  double income_;
  double expend_last;
  double income_last;
  int n;
  longlong time_;
  char authority_;
  char status_;
  string userID_;
  string content_;
  fstream file;
  streamoff in_stack_fffffffffffffce8;
  fpos<__mbstate_t> *in_stack_fffffffffffffcf0;
  ostream *in_stack_fffffffffffffcf8;
  ostream *in_stack_fffffffffffffd00;
  int local_2b8;
  int local_2b4;
  undefined8 local_2b0;
  undefined8 local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  int local_27c;
  longlong local_278;
  char local_26a;
  char local_269;
  string local_268 [32];
  string local_248 [48];
  char local_218 [528];
  commandClass *local_8;
  
  local_8 = this;
  std::fstream::fstream(local_218);
  __a = std::operator|(_S_in,_S_out);
  std::operator|(__a,_S_bin);
  std::fstream::open(local_218,0x11c0a5);
  std::__cxx11::string::string(local_248);
  std::__cxx11::string::string(local_268);
  local_288 = 0.0;
  local_290 = 0.0;
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::istream::seekg(local_218,local_2b0,local_2a8);
  std::istream::read(local_218,(long)&local_27c);
  puts("Reporting Employee-------------------------------------");
  local_2b8 = 0;
  for (local_2b4 = 1; local_2b4 <= local_27c; local_2b4 = local_2b4 + 1) {
    read_string((fstream *)in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8,
                (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
    read_string((fstream *)in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8,
                (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
    std::istream::read(local_218,(long)&local_269);
    std::istream::read(local_218,(long)&local_26a);
    std::istream::read(local_218,(long)&local_278);
    std::istream::read(local_218,(long)&local_298);
    std::istream::read(local_218,(long)&local_2a0);
    if ('0' < local_26a) {
      poVar1 = std::operator<<((ostream *)&std::cout,"COMMAND #");
      local_2b8 = local_2b8 + 1;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2b8);
      poVar1 = std::operator<<(poVar1,":");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,local_268);
      poVar1 = std::operator<<(poVar1," required to ");
      poVar1 = std::operator<<(poVar1,local_248);
      poVar1 = std::operator<<(poVar1," at time: ");
      in_stack_fffffffffffffd00 = (ostream *)std::ostream::operator<<(poVar1,local_278);
      std::ostream::operator<<(in_stack_fffffffffffffd00,std::endl<char,std::char_traits<char>>);
      in_stack_fffffffffffffcf8 = std::operator<<((ostream *)&std::cout,"This line of command was ")
      ;
      pcVar2 = "approved and successfully operated!";
      if (local_269 == '0') {
        pcVar2 = "rejected and ignored...";
      }
      in_stack_fffffffffffffcf0 =
           (fpos<__mbstate_t> *)std::operator<<(in_stack_fffffffffffffcf8,pcVar2);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffcf0,std::endl<char,std::char_traits<char>>);
      if (local_288 < local_298) {
        printf("After this operation, the BookStore earned %.2lf !\n",local_298 - local_288);
      }
      if (local_290 < local_2a0) {
        printf("This operation cost the BookStore %.2lf ...\n",local_2a0 - local_290);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    local_288 = local_298;
    local_290 = local_2a0;
  }
  puts("Employee Report ends-----------------------------------");
  std::fstream::close();
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_248);
  dVar3 = (double)std::fstream::~fstream(local_218);
  return dVar3;
}

Assistant:

void commandClass::log() const {
	fstream file;
	file.open("Data_Basic.dat", ios::in | ios::out | ios::binary);
	string content_, userID_; char status_, authority_; long long time_; int n;
	double income_last = 0, expend_last = 0, income_, expend_;
	file.seekg(24);
	file.read(reinterpret_cast<char *> (&n), 4);
	puts("Reporting Employee-------------------------------------");
	for (int i = 1, Case = 0; i <= n; ++i){
		read_string(file, content_, 250);
		read_string(file, userID_, 31);
		file.read(&status_, 1);
		file.read(&authority_, 1);
		file.read(reinterpret_cast<char *> (&time_), 8);
		file.read(reinterpret_cast<char *> (&income_), 8);
		file.read(reinterpret_cast<char *> (&expend_), 8);
		if (authority_ >= '1') {
			cout << "COMMAND #" << ++Case << ":" << endl;
			cout << userID_ << " required to " << content_ << " at time: " << time_ << endl;
			cout << "This line of command was "
				 << (status_ == '0' ? "rejected and ignored..." : "approved and successfully operated!") << endl;
			if (income_ > income_last) {
				printf("After this operation, the BookStore earned %.2lf !\n", income_ - income_last);
			}
			if (expend_ > expend_last) {
				printf("This operation cost the BookStore %.2lf ...\n", expend_ - expend_last);
			}
			cout << endl;
		}
		income_last = income_, expend_last = expend_;
	}
	puts("Employee Report ends-----------------------------------");
	file.close();
}